

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromExplicitFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  int *piVar1;
  HeapInfo *pHVar2;
  code *pcVar3;
  LargeObjectHeader *this_00;
  bool bVar4;
  undefined4 *puVar5;
  LargeObjectHeader *this_01;
  size_t sVar6;
  FreeObject *pFVar7;
  LargeHeapBlock *this_02;
  HeapBlock *pHVar8;
  undefined6 in_register_0000000a;
  uchar attributes_00;
  FreeObject *this_03;
  FreeObject *this_04;
  LargeObjectHeader *local_50;
  LargeObjectHeader *dbgHeader;
  undefined4 local_3c;
  LargeHeapBucket *local_38;
  
  local_3c = (undefined4)CONCAT62(in_register_0000000a,attributes);
  dbgHeader = (LargeObjectHeader *)recycler;
  local_38 = this;
  if (attributes < ClientTrackedBit) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x196,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar4) goto LAB_006636db;
    *puVar5 = 0;
  }
  this_03 = (FreeObject *)0x0;
  this_04 = local_38->explicitFreeList;
  while( true ) {
    if (this_04 == (FreeObject *)0x0) {
      return (char *)0x0;
    }
    this_01 = LargeHeapBlock::GetHeaderFromAddress(this_04);
    if ((this_01->field_0x1a & 8) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x19e,"(header->isExplicitFreed)","header->isExplicitFreed");
      if (!bVar4) goto LAB_006636db;
      *puVar5 = 0;
    }
    sVar6 = this_01->objectSize;
    if ((sVar6 + 0xff & 0xffffffffffffff00) != (ulong)(local_38->super_HeapBucket).sizeCat) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x19f,
                         "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat)"
                         ,
                         "HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat"
                        );
      if (!bVar4) goto LAB_006636db;
      *puVar5 = 0;
      sVar6 = this_01->objectSize;
    }
    if (sizeCat <= sVar6) break;
    pFVar7 = FreeObject::GetNext(this_04);
    this_03 = this_04;
    this_04 = pFVar7;
  }
  this_01->field_0x1a = this_01->field_0x1a & 0xf7;
  pFVar7 = FreeObject::GetNext(this_04);
  if (this_03 == (FreeObject *)0x0) {
    local_38->explicitFreeList = pFVar7;
  }
  else {
    FreeObject::SetNext(this_03,pFVar7);
  }
  this_00 = dbgHeader;
  this_02 = (LargeHeapBlock *)Recycler::FindHeapBlock((Recycler *)dbgHeader,this_04);
  if (this_02 == (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b3,"(heapBlockVerify != nullptr)","heapBlockVerify != nullptr");
    if (!bVar4) goto LAB_006636db;
    *puVar5 = 0;
  }
  if ((this_02->super_HeapBlock).heapBlockType != LargeBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b4,"(heapBlockVerify->IsLargeHeapBlock())",
                       "heapBlockVerify->IsLargeHeapBlock()");
    if (!bVar4) goto LAB_006636db;
    *puVar5 = 0;
  }
  bVar4 = LargeHeapBlock::GetObjectHeader(this_02,this_04,&local_50);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b7,"(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader))",
                       "largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader)");
    if (!bVar4) goto LAB_006636db;
    *puVar5 = 0;
  }
  if (local_50 != this_01) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1b8,"(dbgHeader == header)","dbgHeader == header");
    if (!bVar4) {
LAB_006636db:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this_04->taggedNext = 0;
  attributes_00 = (uchar)local_3c;
  LargeObjectHeader::SetAttributes(this_01,this_00->objectIndex,attributes_00);
  if (-1 < (char)attributes_00) {
    return (char *)this_04;
  }
  pHVar8 = Recycler::FindHeapBlock((Recycler *)this_00,this_04);
  piVar1 = (int *)((long)&pHVar8[4].address + 4);
  *piVar1 = *piVar1 + 1;
  pHVar2 = (local_38->super_HeapBucket).heapInfo;
  pHVar2->liveFinalizableObjectCount = pHVar2->liveFinalizableObjectCount + 1;
  pHVar2->newFinalizableObjectCount = pHVar2->newFinalizableObjectCount + 1;
  return (char *)this_04;
}

Assistant:

char *
LargeHeapBucket::TryAllocFromExplicitFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    FreeObject * currFreeObject = this->explicitFreeList;
    FreeObject * prevFreeObject = nullptr;
    while (currFreeObject != nullptr)
    {
        char * memBlock = (char *)currFreeObject;
        LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(memBlock);
        Assert(header->isExplicitFreed);
        Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat);
        if (header->objectSize < sizeCat)
        {
            prevFreeObject = currFreeObject;
            currFreeObject = currFreeObject->GetNext();
            continue;
        }

        DebugOnly(header->isExplicitFreed = false);
        if (prevFreeObject)
        {
            prevFreeObject->SetNext(currFreeObject->GetNext());
        }
        else
        {
            this->explicitFreeList = currFreeObject->GetNext();
        }

#ifdef RECYCLER_MEMORY_VERIFY
        HeapBlock* heapBlockVerify = recycler->FindHeapBlock(memBlock);
        Assert(heapBlockVerify != nullptr);
        Assert(heapBlockVerify->IsLargeHeapBlock());
        LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlockVerify;
        LargeObjectHeader * dbgHeader;
        Assert(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader));
        Assert(dbgHeader == header);

        ((FreeObject *)memBlock)->DebugFillNext();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
        // TODO: large heap block doesn't separate leaf object on to different page allocator.
        // so all the memory should still be zeroed.
        memset(memBlock, 0, sizeof(FreeObject));
#endif
        header->SetAttributes(recycler->Cookie, (attributes & StoredObjectInfoBitMask));

        if ((attributes & ObjectInfoBits::FinalizeBit) != 0)
        {
            LargeHeapBlock* heapBlock = (LargeHeapBlock *)recycler->FindHeapBlock(memBlock);
            heapBlock->finalizeCount++;
#ifdef RECYCLER_FINALIZE_CHECK
            heapInfo->liveFinalizableObjectCount++;
            heapInfo->newFinalizableObjectCount++;
#endif
        }
        return memBlock;
    }

    return nullptr;
}